

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall
QTreeWidgetItem::QTreeWidgetItem
          (QTreeWidgetItem *this,QTreeWidgetItem *parent,QStringList *strings,int type)

{
  QTreeWidgetItemPrivate *pQVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QVariant QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_0081e7f0;
  this->rtti = type;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QList<QWidgetItemData> *)0x0;
  (this->values).d.size = 0;
  this->view = (QTreeWidget *)0x0;
  pQVar1 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar1->q = this;
  (pQVar1->display).d.d = (Data *)0x0;
  (pQVar1->display).d.ptr = (QVariant *)0x0;
  (pQVar1->display).d.size = 0;
  pQVar1->field_0x20 = pQVar1->field_0x20 & 0xf8;
  pQVar1->rowGuess = -1;
  pQVar1->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar1;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x3d;
  if ((strings->d).size != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      ::QVariant::QVariant(&QStack_58,(QString *)((long)&(((strings->d).ptr)->d).d + lVar2));
      (*this->_vptr_QTreeWidgetItem[4])(this,uVar3 & 0xffffffff,0,&QStack_58);
      ::QVariant::~QVariant(&QStack_58);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar3 < (ulong)(strings->d).size);
  }
  if (parent != (QTreeWidgetItem *)0x0) {
    insertChild(parent,(int)(parent->children).d.size,this);
    this->d->rowGuess = (int)(parent->children).d.size + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *parent, const QStringList &strings, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    for (int i = 0; i < strings.size(); ++i)
        setText(i, strings.at(i));
    if (parent)
        parent->addChild(this);
}